

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int MemHashGrowTable(mem_hash_kv_engine *pEngine)

{
  uint uVar1;
  uint uVar2;
  mem_hash_record *pmVar3;
  mem_hash_record *pmVar4;
  uint uVar5;
  mem_hash_record **ppmVar6;
  mem_hash_record **ppmVar7;
  mem_hash_record **ppmVar8;
  uint uVar9;
  uint uVar10;
  
  uVar2 = pEngine->nBucket;
  ppmVar6 = (mem_hash_record **)SyMemBackendAlloc(&pEngine->sAlloc,uVar2 << 4);
  ppmVar8 = ppmVar6;
  if (ppmVar6 != (mem_hash_record **)0x0) {
    if ((uVar2 & 0xfffffff) != 0) {
      ppmVar7 = (mem_hash_record **)((long)ppmVar6 + (ulong)(uVar2 << 4));
      do {
        *(undefined1 *)ppmVar8 = 0;
        if (ppmVar7 <= (mem_hash_record **)((long)ppmVar8 + 1)) break;
        *(undefined1 *)((long)ppmVar8 + 1) = 0;
        if (ppmVar7 <= (mem_hash_record **)((long)ppmVar8 + 2)) break;
        *(undefined1 *)((long)ppmVar8 + 2) = 0;
        if (ppmVar7 <= (mem_hash_record **)((long)ppmVar8 + 3)) break;
        *(undefined1 *)((long)ppmVar8 + 3) = 0;
        ppmVar8 = (mem_hash_record **)((long)ppmVar8 + 4);
      } while (ppmVar8 < ppmVar7);
    }
    uVar5 = pEngine->nRecord;
    if (uVar5 != 0) {
      ppmVar8 = &pEngine->pLast;
      uVar1 = uVar2 * 2 - 1;
      uVar9 = 0;
      do {
        pmVar3 = *ppmVar8;
        pmVar3->pNextHash = (mem_hash_record *)0x0;
        pmVar3->pPrevHash = (mem_hash_record *)0x0;
        uVar10 = pmVar3->nHash & uVar1;
        pmVar4 = ppmVar6[uVar10];
        pmVar3->pNextHash = pmVar4;
        if (pmVar4 != (mem_hash_record *)0x0) {
          pmVar4->pPrevHash = pmVar3;
        }
        ppmVar6[uVar10] = pmVar3;
        if (uVar5 <= uVar9 + 1) break;
        pmVar3 = pmVar3->pNext;
        pmVar3->pNextHash = (mem_hash_record *)0x0;
        pmVar3->pPrevHash = (mem_hash_record *)0x0;
        uVar10 = pmVar3->nHash & uVar1;
        pmVar4 = ppmVar6[uVar10];
        pmVar3->pNextHash = pmVar4;
        if (pmVar4 != (mem_hash_record *)0x0) {
          pmVar4->pPrevHash = pmVar3;
        }
        ppmVar6[uVar10] = pmVar3;
        if (uVar5 <= uVar9 + 2) break;
        pmVar3 = pmVar3->pNext;
        pmVar3->pNextHash = (mem_hash_record *)0x0;
        pmVar3->pPrevHash = (mem_hash_record *)0x0;
        uVar10 = pmVar3->nHash & uVar1;
        pmVar4 = ppmVar6[uVar10];
        pmVar3->pNextHash = pmVar4;
        if (pmVar4 != (mem_hash_record *)0x0) {
          pmVar4->pPrevHash = pmVar3;
        }
        ppmVar6[uVar10] = pmVar3;
        if (uVar5 <= uVar9 + 3) break;
        pmVar3 = pmVar3->pNext;
        pmVar3->pNextHash = (mem_hash_record *)0x0;
        pmVar3->pPrevHash = (mem_hash_record *)0x0;
        uVar10 = pmVar3->nHash & uVar1;
        pmVar4 = ppmVar6[uVar10];
        pmVar3->pNextHash = pmVar4;
        if (pmVar4 != (mem_hash_record *)0x0) {
          pmVar4->pPrevHash = pmVar3;
        }
        ppmVar6[uVar10] = pmVar3;
        ppmVar8 = &pmVar3->pNext;
        uVar9 = uVar9 + 4;
      } while (uVar9 < uVar5);
    }
    uVar5 = SyMemBackendFree(&pEngine->sAlloc,pEngine->apBucket);
    ppmVar8 = (mem_hash_record **)(ulong)uVar5;
    pEngine->apBucket = ppmVar6;
    pEngine->nBucket = uVar2 * 2;
  }
  return (int)ppmVar8;
}

Assistant:

static int MemHashGrowTable(mem_hash_kv_engine *pEngine)
{
	sxu32 nNewSize = pEngine->nBucket << 1;
	mem_hash_record *pEntry;
	mem_hash_record **apNew;
	sxu32 n,iBucket;
	/* Allocate a new larger table */
	apNew = (mem_hash_record **)SyMemBackendAlloc(&pEngine->sAlloc, nNewSize * sizeof(mem_hash_record *));
	if( apNew == 0 ){
		/* Not so fatal, simply a performance hit */
		return UNQLITE_OK;
	}
	/* Zero the new table */
	SyZero((void *)apNew, nNewSize * sizeof(mem_hash_record *));
	/* Rehash all entries */
	n = 0;
	pEntry = pEngine->pLast;
	for(;;){
		
		/* Loop one */
		if( n >= pEngine->nRecord ){
			break;
		}
		pEntry->pNextHash = pEntry->pPrevHash = 0;
		/* Install in the new bucket */
		iBucket = pEntry->nHash & (nNewSize - 1);
		pEntry->pNextHash = apNew[iBucket];
		if( apNew[iBucket] ){
			apNew[iBucket]->pPrevHash = pEntry;
		}
		apNew[iBucket] = pEntry;
		/* Point to the next entry */
		pEntry = pEntry->pNext;
		n++;

		/* Loop two */
		if( n >= pEngine->nRecord ){
			break;
		}
		pEntry->pNextHash = pEntry->pPrevHash = 0;
		/* Install in the new bucket */
		iBucket = pEntry->nHash & (nNewSize - 1);
		pEntry->pNextHash = apNew[iBucket];
		if( apNew[iBucket] ){
			apNew[iBucket]->pPrevHash = pEntry;
		}
		apNew[iBucket] = pEntry;
		/* Point to the next entry */
		pEntry = pEntry->pNext;
		n++;

		/* Loop three */
		if( n >= pEngine->nRecord ){
			break;
		}
		pEntry->pNextHash = pEntry->pPrevHash = 0;
		/* Install in the new bucket */
		iBucket = pEntry->nHash & (nNewSize - 1);
		pEntry->pNextHash = apNew[iBucket];
		if( apNew[iBucket] ){
			apNew[iBucket]->pPrevHash = pEntry;
		}
		apNew[iBucket] = pEntry;
		/* Point to the next entry */
		pEntry = pEntry->pNext;
		n++;

		/* Loop four */
		if( n >= pEngine->nRecord ){
			break;
		}
		pEntry->pNextHash = pEntry->pPrevHash = 0;
		/* Install in the new bucket */
		iBucket = pEntry->nHash & (nNewSize - 1);
		pEntry->pNextHash = apNew[iBucket];
		if( apNew[iBucket] ){
			apNew[iBucket]->pPrevHash = pEntry;
		}
		apNew[iBucket] = pEntry;
		/* Point to the next entry */
		pEntry = pEntry->pNext;
		n++;
	}
	/* Release the old table and reflect the change */
	SyMemBackendFree(&pEngine->sAlloc,(void *)pEngine->apBucket);
	pEngine->apBucket = apNew;
	pEngine->nBucket  = nNewSize;
	return UNQLITE_OK;
}